

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::PathTypeHandlerBase::HasProperty
          (PathTypeHandlerBase *this,DynamicObject *instance,JavascriptString *propertyNameString)

{
  BOOL BVar1;
  PropertyRecord *in_RAX;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  
  local_28 = in_RAX;
  ScriptContext::GetOrAddPropertyRecord
            ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_28);
  BVar1 = HasProperty(this,instance,local_28->pid,(bool *)0x0,(PropertyValueInfo *)0x0);
  return BVar1;
}

Assistant:

BOOL PathTypeHandlerBase::HasProperty(DynamicObject* instance, JavascriptString* propertyNameString)
    {
        // Consider: Implement actual string hash lookup
        PropertyRecord const* propertyRecord;
        instance->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return PathTypeHandlerBase::HasProperty(instance, propertyRecord->GetPropertyId());
    }